

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::provokeReset
          (BasicResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  ContextReset *pCVar2;
  MessageBuilder local_198;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *local_18;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset_local;
  BasicResetCase *this_local;
  
  local_18 = contextReset;
  contextReset_local = (SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *)this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_198,
                      (char (*) [79])
                      "Check the graphics reset status returned by glGetGraphicsResetStatus() equals "
                     );
  pMVar1 = tcu::MessageBuilder::operator<<
                     (pMVar1,(char (*) [48])"GL_GUILTY_CONTEXT_RESET after a context reset\n\n");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  pCVar2 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(local_18);
  (*pCVar2->_vptr_ContextReset[2])();
  pCVar2 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(local_18);
  (*pCVar2->_vptr_ContextReset[3])();
  return;
}

Assistant:

virtual void provokeReset (de::SharedPtr<ContextReset>& contextReset)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Check the graphics reset status returned by glGetGraphicsResetStatus() equals "
							<< "GL_GUILTY_CONTEXT_RESET after a context reset\n\n"
							<< tcu::TestLog::EndMessage;

		contextReset->setup();
		contextReset->draw();
	}